

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O3

int Abc_NtkSweepBufsInvs(Abc_Ntk_t *pNtk,int fVerbose)

{
  ulong uVar1;
  Hop_Man_t *p;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pAVar2;
  bool bVar3;
  int iVar4;
  int *__s;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t *pHVar6;
  Vec_Ptr_t *pVVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x3ce,"int Abc_NtkSweepBufsInvs(Abc_Ntk_t *, int)");
  }
  iVar4 = Abc_NtkToAig(pNtk);
  if (iVar4 == 0) {
    fwrite("Converting to SOP has failed.\n",0x1e,1,_stdout);
    uVar11 = 1;
  }
  else {
    p = (Hop_Man_t *)pNtk->pManFunc;
    uVar8 = extraout_RDX;
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar4 = pNtk->vObjs->nSize;
      uVar1 = (long)iVar4 + 500;
      iVar9 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar9) {
        __s = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = __s;
        if (__s == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar9;
        uVar8 = extraout_RDX_00;
      }
      else {
        __s = (int *)0x0;
      }
      if (-500 < iVar4) {
        memset(__s,0,(uVar1 & 0xffffffff) << 2);
        uVar8 = extraout_RDX_01;
      }
      (pNtk->vTravIds).nSize = iVar9;
    }
    iVar4 = pNtk->nTravIds;
    pNtk->nTravIds = iVar4 + 1;
    if (0x3ffffffe < iVar4) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    pVVar7 = pNtk->vObjs;
    uVar11 = 0;
    do {
      if (pVVar7->nSize < 1) break;
      lVar12 = 0;
      bVar3 = false;
      do {
        pObj = (Abc_Obj_t *)pVVar7->pArray[lVar12];
        if ((pObj != (Abc_Obj_t *)0x0) && (0 < (pObj->vFanins).nSize)) {
          lVar10 = 0;
          do {
            pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar10]];
            pAVar2 = pNode->pNtk;
            iVar4 = pNode->Id;
            Vec_IntFillExtra(&pAVar2->vTravIds,iVar4 + 1,(int)uVar8);
            if (((long)iVar4 < 0) || ((pAVar2->vTravIds).nSize <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar8 = extraout_RDX_02;
            if (((((pAVar2->vTravIds).pArray[iVar4] != pNode->pNtk->nTravIds) &&
                 ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) && ((pNode->vFanins).nSize == 1)) &&
               (((*(uint *)&pObj->field_0x14 & 0xf) - 5 < 0xfffffffe ||
                (iVar4 = Abc_NodeIsInv(pNode), uVar8 = extraout_RDX_03, iVar4 == 0)))) {
              iVar4 = Abc_NodeIsInv(pNode);
              if (iVar4 != 0) {
                pHVar6 = (Hop_Obj_t *)(pObj->field_5).pData;
                pHVar5 = Hop_IthVar(p,(int)lVar10);
                pHVar6 = Hop_Compose(p,pHVar6,(Hop_Obj_t *)((ulong)pHVar5 ^ 1),(int)lVar10);
                (pObj->field_5).pData = pHVar6;
              }
              uVar11 = uVar11 + 1;
              Abc_ObjPatchFanin(pObj,pNode,
                                (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]);
              bVar3 = true;
              uVar8 = extraout_RDX_04;
              if ((pNode->vFanouts).nSize == 0) {
                Abc_NtkDeleteObj(pNode);
                uVar8 = extraout_RDX_05;
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < (pObj->vFanins).nSize);
          pVVar7 = pNtk->vObjs;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar7->nSize);
    } while (bVar3);
    if (fVerbose != 0) {
      printf("Removed %d single input nodes.\n",(ulong)uVar11);
    }
  }
  return uVar11;
}

Assistant:

int Abc_NtkSweepBufsInvs( Abc_Ntk_t * pNtk, int fVerbose )
{
    Hop_Man_t * pMan;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, fChanges = 1, Counter = 0;
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to SOP has failed.\n" );
        return 1;
    }
    // get AIG manager
    pMan = (Hop_Man_t *)pNtk->pManFunc;
    // label selected nodes
    Abc_NtkIncrementTravId( pNtk );
    // iterate till no improvement
    while ( fChanges )
    {
        fChanges = 0;
        Abc_NtkForEachObj( pNtk, pObj, i )
        {
            Abc_ObjForEachFanin( pObj, pFanin, k )
            {
                // do not eliminate marked fanins
                if ( Abc_NodeIsTravIdCurrent(pFanin) )
                    continue;
                // do not eliminate constant nodes
                if ( !Abc_ObjIsNode(pFanin) || Abc_ObjFaninNum(pFanin) != 1 )
                    continue;
                // do not eliminate inverters into COs
                if ( Abc_ObjIsCo(pObj) && Abc_NodeIsInv(pFanin) )
                    continue;
                // do not eliminate buffers connecting PIs and POs 
//                if ( Abc_ObjIsCo(pObj) && Abc_ObjIsCi(Abc_ObjFanin0(pFanin)) )
//                    continue;
                fChanges = 1;
                Counter++;
                // update function of the node
                if ( Abc_NodeIsInv(pFanin) )
                    pObj->pData = Hop_Compose( pMan, (Hop_Obj_t *)pObj->pData, Hop_Not(Hop_IthVar(pMan, k)), k );
                // update the fanin
                Abc_ObjPatchFanin( pObj, pFanin, Abc_ObjFanin0(pFanin) );
                if ( Abc_ObjFanoutNum(pFanin) == 0 )
                    Abc_NtkDeleteObj(pFanin);            
            }
        }
    }
    if ( fVerbose )
        printf( "Removed %d single input nodes.\n", Counter );
    return Counter;
}